

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall File::setText(File *this,string *text)

{
  u16string local_38;
  string *local_18;
  string *text_local;
  File *this_local;
  
  local_18 = text;
  text_local = (string *)this;
  UtfHandler::utf8to16(&local_38,&this->utf,text);
  TextBuffer::set_text(&this->buffer,&local_38);
  std::__cxx11::u16string::~u16string((u16string *)&local_38);
  if ((this->hasParser & 1U) != 0) {
    ts_tree_delete(this->tree);
    this->tree = (TSTree *)0x0;
    executeParse(this);
  }
  return;
}

Assistant:

void File::setText (std::string &&text) {
    buffer.set_text(utf.utf8to16(text));

    if (hasParser) {
        ts_tree_delete(tree);
        tree = nullptr;
        executeParse();
    }
}